

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::getLimit(Calendar *this,UCalendarDateFields field,ELimitType limitType)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int32_t daysInMonth;
  int32_t minDaysInFirst;
  int32_t limit;
  ELimitType limitType_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  if (field == UCAL_WEEK_OF_MONTH) {
    if (limitType == UCAL_LIMIT_MINIMUM) {
      uVar1 = getMinimalDaysInFirstWeek(this);
      daysInMonth = (int32_t)(uVar1 == '\x01');
    }
    else if (limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
      daysInMonth = 1;
    }
    else {
      bVar2 = getMinimalDaysInFirstWeek(this);
      iVar3 = (*(this->super_UObject)._vptr_UObject[0x1f])(this,5,(ulong)limitType);
      if (limitType == UCAL_LIMIT_LEAST_MAXIMUM) {
        iVar4 = 7 - (uint)bVar2;
      }
      else {
        iVar4 = 0xd - (uint)bVar2;
      }
      daysInMonth = (iVar3 + iVar4) / 7;
    }
    this_local._4_4_ = daysInMonth;
  }
  else if ((((field == UCAL_DAY_OF_WEEK) || (field - UCAL_AM_PM < 8)) || (field == UCAL_DOW_LOCAL))
          || (field - UCAL_JULIAN_DAY < 3)) {
    this_local._4_4_ = *(int *)(kCalendarLimits + (ulong)limitType * 4 + (ulong)field * 0x10);
  }
  else {
    this_local._4_4_ =
         (*(this->super_UObject)._vptr_UObject[0x1f])(this,(ulong)field,(ulong)limitType);
  }
  return this_local._4_4_;
}

Assistant:

int32_t Calendar::getLimit(UCalendarDateFields field, ELimitType limitType) const {
    switch (field) {
    case UCAL_DAY_OF_WEEK:
    case UCAL_AM_PM:
    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_ZONE_OFFSET:
    case UCAL_DST_OFFSET:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
    case UCAL_MILLISECONDS_IN_DAY:
    case UCAL_IS_LEAP_MONTH:
        return kCalendarLimits[field][limitType];

    case UCAL_WEEK_OF_MONTH:
        {
            int32_t limit;
            if (limitType == UCAL_LIMIT_MINIMUM) {
                limit = getMinimalDaysInFirstWeek() == 1 ? 1 : 0;
            } else if (limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
                limit = 1;
            } else {
                int32_t minDaysInFirst = getMinimalDaysInFirstWeek();
                int32_t daysInMonth = handleGetLimit(UCAL_DAY_OF_MONTH, limitType);
                if (limitType == UCAL_LIMIT_LEAST_MAXIMUM) {
                    limit = (daysInMonth + (7 - minDaysInFirst)) / 7;
                } else { // limitType == UCAL_LIMIT_MAXIMUM
                    limit = (daysInMonth + 6 + (7 - minDaysInFirst)) / 7;
                }
            }
            return limit;
        }
    default:
        return handleGetLimit(field, limitType);
    }
}